

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_register_error(arg_end *end,void *parent,int error,char *argval)

{
  char *argval_local;
  int error_local;
  void *parent_local;
  arg_end *end_local;
  
  if (end->count < (end->hdr).maxcount) {
    end->error[end->count] = error;
    end->parent[end->count] = parent;
    end->argval[end->count] = argval;
    end->count = end->count + 1;
  }
  else {
    end->error[(end->hdr).maxcount + -1] = 1;
    end->parent[(end->hdr).maxcount + -1] = end;
    end->argval[(end->hdr).maxcount + -1] = (char *)0x0;
  }
  return;
}

Assistant:

static void arg_register_error(struct arg_end* end, void* parent, int error, const char* argval) {
    /* printf("arg_register_error(%p,%p,%d,%s)\n",end,parent,error,argval); */
    if (end->count < end->hdr.maxcount) {
        end->error[end->count] = error;
        end->parent[end->count] = parent;
        end->argval[end->count] = argval;
        end->count++;
    } else {
        end->error[end->hdr.maxcount - 1] = ARG_ELIMIT;
        end->parent[end->hdr.maxcount - 1] = end;
        end->argval[end->hdr.maxcount - 1] = NULL;
    }
}